

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publickey.c
# Opt level: O0

int libssh2_publickey_remove_ex
              (LIBSSH2_PUBLICKEY *pkey,uchar *name,unsigned_long name_len,uchar *blob,
              unsigned_long blob_len)

{
  LIBSSH2_CHANNEL *channel_00;
  LIBSSH2_SESSION *session_00;
  int iVar1;
  size_t sVar2;
  uchar *puVar3;
  ssize_t sVar4;
  ssize_t nwritten;
  int rc;
  unsigned_long packet_len;
  LIBSSH2_SESSION *session;
  LIBSSH2_CHANNEL *channel;
  unsigned_long blob_len_local;
  uchar *blob_local;
  unsigned_long name_len_local;
  uchar *name_local;
  LIBSSH2_PUBLICKEY *pkey_local;
  
  sVar2 = name_len + 0x16 + blob_len;
  if (pkey == (LIBSSH2_PUBLICKEY *)0x0) {
    return -0x27;
  }
  channel_00 = pkey->channel;
  session_00 = channel_00->session;
  if (pkey->remove_state == libssh2_NB_state_idle) {
    pkey->remove_packet = (uchar *)0x0;
    puVar3 = (uchar *)(*session_00->alloc)(sVar2,&session_00->abstract);
    pkey->remove_packet = puVar3;
    if (pkey->remove_packet == (uchar *)0x0) {
      iVar1 = _libssh2_error(session_00,-6,
                             "Unable to allocate memory for publickey \"remove\" packet");
      return iVar1;
    }
    pkey->remove_s = pkey->remove_packet;
    _libssh2_htonu32(pkey->remove_s,(int)sVar2 - 4);
    pkey->remove_s = pkey->remove_s + 4;
    _libssh2_htonu32(pkey->remove_s,6);
    pkey->remove_s = pkey->remove_s + 4;
    builtin_memcpy(pkey->remove_s,"remove",6);
    pkey->remove_s = pkey->remove_s + 6;
    _libssh2_htonu32(pkey->remove_s,(uint32_t)name_len);
    pkey->remove_s = pkey->remove_s + 4;
    memcpy(pkey->remove_s,name,name_len);
    pkey->remove_s = pkey->remove_s + name_len;
    _libssh2_htonu32(pkey->remove_s,(uint32_t)blob_len);
    pkey->remove_s = pkey->remove_s + 4;
    memcpy(pkey->remove_s,blob,blob_len);
    pkey->remove_s = pkey->remove_s + blob_len;
    pkey->remove_state = libssh2_NB_state_created;
  }
  if (pkey->remove_state == libssh2_NB_state_created) {
    sVar4 = _libssh2_channel_write
                      (channel_00,0,pkey->remove_packet,
                       (long)pkey->remove_s - (long)pkey->remove_packet);
    if (sVar4 == -0x25) {
      return -0x25;
    }
    if ((long)pkey->remove_s - (long)pkey->remove_packet != sVar4) {
      (*session_00->free)(pkey->remove_packet,&session_00->abstract);
      pkey->remove_packet = (uchar *)0x0;
      pkey->remove_state = libssh2_NB_state_idle;
      iVar1 = _libssh2_error(session_00,-7,"Unable to send publickey remove packet");
      return iVar1;
    }
    (*session_00->free)(pkey->remove_packet,&session_00->abstract);
    pkey->remove_packet = (uchar *)0x0;
    pkey->remove_state = libssh2_NB_state_sent;
  }
  iVar1 = publickey_response_success(pkey);
  if (iVar1 != -0x25) {
    pkey->remove_state = libssh2_NB_state_idle;
  }
  return iVar1;
}

Assistant:

LIBSSH2_API int
libssh2_publickey_remove_ex(LIBSSH2_PUBLICKEY * pkey,
                            const unsigned char *name, unsigned long name_len,
                            const unsigned char *blob, unsigned long blob_len)
{
    LIBSSH2_CHANNEL *channel;
    LIBSSH2_SESSION *session;
    /* 22 = packet_len(4) + remove_len(4) + "remove"(6) + name_len(4) + {name}
       + blob_len(4) + {blob} */
    unsigned long packet_len = 22 + name_len + blob_len;
    int rc;

    if(!pkey)
        return LIBSSH2_ERROR_BAD_USE;

    channel = pkey->channel;
    session = channel->session;

    if(pkey->remove_state == libssh2_NB_state_idle) {
        pkey->remove_packet = NULL;

        pkey->remove_packet = LIBSSH2_ALLOC(session, packet_len);
        if(!pkey->remove_packet) {
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for "
                                  "publickey \"remove\" packet");
        }

        pkey->remove_s = pkey->remove_packet;
        _libssh2_htonu32(pkey->remove_s, (uint32_t)(packet_len - 4));
        pkey->remove_s += 4;
        _libssh2_htonu32(pkey->remove_s, sizeof("remove") - 1);
        pkey->remove_s += 4;
        memcpy(pkey->remove_s, "remove", sizeof("remove") - 1);
        pkey->remove_s += sizeof("remove") - 1;
        _libssh2_htonu32(pkey->remove_s, (uint32_t)name_len);
        pkey->remove_s += 4;
        memcpy(pkey->remove_s, name, name_len);
        pkey->remove_s += name_len;
        _libssh2_htonu32(pkey->remove_s, (uint32_t)blob_len);
        pkey->remove_s += 4;
        memcpy(pkey->remove_s, blob, blob_len);
        pkey->remove_s += blob_len;

        _libssh2_debug((session, LIBSSH2_TRACE_PUBLICKEY,
                       "Sending publickey \"remove\" packet: "
                       "type=%s blob_len=%ld",
                       name, blob_len));

        pkey->remove_state = libssh2_NB_state_created;
    }

    if(pkey->remove_state == libssh2_NB_state_created) {
        ssize_t nwritten;
        nwritten = _libssh2_channel_write(channel, 0, pkey->remove_packet,
                                       (pkey->remove_s - pkey->remove_packet));
        if(nwritten == LIBSSH2_ERROR_EAGAIN) {
            return (int)nwritten;
        }
        else if((pkey->remove_s - pkey->remove_packet) != nwritten) {
            LIBSSH2_FREE(session, pkey->remove_packet);
            pkey->remove_packet = NULL;
            pkey->remove_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "Unable to send publickey remove packet");
        }
        LIBSSH2_FREE(session, pkey->remove_packet);
        pkey->remove_packet = NULL;

        pkey->remove_state = libssh2_NB_state_sent;
    }

    rc = publickey_response_success(pkey);
    if(rc == LIBSSH2_ERROR_EAGAIN) {
        return rc;
    }

    pkey->remove_state = libssh2_NB_state_idle;

    return rc;
}